

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

lineiter_t * lineiter_next_plain(lineiter_t *li)

{
  char *pcVar1;
  size_t sVar2;
  lineiter_t *li_local;
  
  li->lineno = li->lineno + 1;
  pcVar1 = fgets(li->buf,li->bsiz,(FILE *)li->fh);
  if (pcVar1 == (char *)0x0) {
    lineiter_free(li);
    li_local = (lineiter_t *)0x0;
  }
  else {
    sVar2 = strlen(li->buf);
    li->len = (int32)sVar2;
    li_local = li;
    if ((li->bsiz + -1 <= li->len) && (li->buf[li->len + -1] != '\n')) {
      while( true ) {
        li->bsiz = li->bsiz << 1;
        pcVar1 = (char *)__ckd_realloc__(li->buf,(long)li->bsiz,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                                         ,0x149);
        li->buf = pcVar1;
        pcVar1 = fgets(li->buf + li->len,li->bsiz - li->len,(FILE *)li->fh);
        if (pcVar1 == (char *)0x0) break;
        sVar2 = strlen(li->buf + li->len);
        li->len = li->len + (int)sVar2;
        if (li->len < li->bsiz + -1) {
          return li;
        }
        if (li->buf[li->len + -1] == '\n') {
          return li;
        }
      }
      sVar2 = strlen(li->buf + li->len);
      li->len = li->len + (int)sVar2;
    }
  }
  return li_local;
}

Assistant:

static lineiter_t *
lineiter_next_plain(lineiter_t *li)
{
    /* We are reading the next line */
    li->lineno++;
    
    /* Read a line and check for EOF. */
    if (fgets(li->buf, li->bsiz, li->fh) == NULL) {
        lineiter_free(li);
        return NULL;
    }
    /* If we managed to read the whole thing, then we are done
     * (this will be by far the most common result). */
    li->len = (int32)strlen(li->buf);
    if (li->len < li->bsiz - 1 || li->buf[li->len - 1] == '\n')
        return li;

    /* Otherwise we have to reallocate and keep going. */
    while (1) {
        li->bsiz *= 2;
        li->buf = (char *)ckd_realloc(li->buf, li->bsiz);
        /* If we get an EOF, we are obviously done. */
        if (fgets(li->buf + li->len, li->bsiz - li->len, li->fh) == NULL) {
            li->len += strlen(li->buf + li->len);
            return li;
        }
        li->len += strlen(li->buf + li->len);
        /* If we managed to read the whole thing, then we are done. */
        if (li->len < li->bsiz - 1 || li->buf[li->len - 1] == '\n')
            return li;
    }

    /* Shouldn't get here. */
    return li;
}